

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

Abc_Obj_t * Io_ReadCreateConst(Abc_Ntk_t *pNtk,char *pName,int fConst1)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_38;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pNet;
  int fConst1_local;
  char *pName_local;
  Abc_Ntk_t *pNtk_local;
  
  if (fConst1 == 0) {
    local_38 = Abc_NtkCreateNodeConst0(pNtk);
  }
  else {
    local_38 = Abc_NtkCreateNodeConst1(pNtk);
  }
  pObj = Abc_NtkFindNet(pNtk,pName);
  if (pObj != (Abc_Obj_t *)0x0) {
    Abc_ObjAddFanin(pObj,local_38);
    return local_38;
  }
  __assert_fail("pNet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioUtil.c"
                ,0x2fc,"Abc_Obj_t *Io_ReadCreateConst(Abc_Ntk_t *, char *, int)");
}

Assistant:

Abc_Obj_t * Io_ReadCreateConst( Abc_Ntk_t * pNtk, char * pName, int fConst1 )
{
    Abc_Obj_t * pNet, * pTerm;
    pTerm = fConst1? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
    pNet  = Abc_NtkFindNet(pNtk, pName);    assert( pNet );
    Abc_ObjAddFanin( pNet, pTerm );
    return pTerm;
}